

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::reportOnPossibleLpDualInfeasibility(HEkkDual *this)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDI;
  string lp_dual_status;
  HighsSimplexAnalysis *analysis;
  HighsSimplexInfo *info;
  string local_38 [32];
  long local_18;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x10) + 0x2560;
  local_18 = *(long *)(in_RDI + 0x10) + 0x18;
  std::__cxx11::string::string(local_38);
  if (*(int *)(local_18 + 0x1b8) == 0) {
    std::__cxx11::string::operator=(local_38,"feasible");
  }
  else {
    std::__cxx11::string::operator=(local_38,"infeasible");
  }
  lVar1 = *(long *)(*(long *)(in_RDI + 0x10) + 8);
  uVar2 = std::__cxx11::string::c_str();
  highsLogDev(*(HighsLogOptions **)(local_10 + 1000),*(HighsLogType *)(local_18 + 0x1c0),
              *(char **)(local_18 + 0x1c8),lVar1 + 0x380,1,
              "LP is dual %s with dual phase 1 objective %10.4g and num / max / sum dual infeasibilities = %d / %9.4g / %9.4g\n"
              ,uVar2,(ulong)*(uint *)(local_18 + 0x1b8));
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void HEkkDual::reportOnPossibleLpDualInfeasibility() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexAnalysis& analysis = ekk_instance_.analysis_;
  assert(solve_phase == kSolvePhase1);
  assert(row_out == kNoRowChosen);
  //  assert(info.dual_objective_value < 0);
  assert(!info.costs_perturbed);
  std::string lp_dual_status;
  if (analysis.num_dual_phase_1_lp_dual_infeasibility) {
    lp_dual_status = "infeasible";
  } else {
    lp_dual_status = "feasible";
  }
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
              "LP is dual %s with dual phase 1 objective %10.4g and num / "
              "max / sum dual infeasibilities = %" HIGHSINT_FORMAT
              " / %9.4g / %9.4g\n",
              lp_dual_status.c_str(), info.dual_objective_value,
              analysis.num_dual_phase_1_lp_dual_infeasibility,
              analysis.max_dual_phase_1_lp_dual_infeasibility,
              analysis.sum_dual_phase_1_lp_dual_infeasibility);
}